

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_lshift_fixed_into(mp_int *r,mp_int *a,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  byte bVar3;
  BignumInt BVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (r->nw != 0) {
    uVar8 = bits >> 6;
    bVar3 = (byte)bits & 0x3f;
    sVar6 = r->nw;
    do {
      uVar7 = sVar6 - 1;
      if (uVar7 < uVar8) {
        r->w[uVar7] = 0;
      }
      else {
        uVar1 = a->nw;
        if ((-uVar8 + sVar6) - 1 < uVar1) {
          BVar4 = a->w[uVar7 - uVar8];
        }
        else {
          BVar4 = 0;
        }
        pBVar2 = r->w;
        pBVar2[uVar7] = BVar4;
        if ((bits & 0x3f) != 0) {
          uVar5 = BVar4 << bVar3;
          pBVar2[uVar7] = uVar5;
          if (uVar8 < uVar7) {
            if ((-uVar8 + sVar6) - 2 < uVar1) {
              BVar4 = a->w[(sVar6 - 2) - uVar8];
            }
            else {
              BVar4 = 0;
            }
            pBVar2[uVar7] = BVar4 >> (0x40 - bVar3 & 0x3f) | uVar5;
          }
        }
      }
      sVar6 = uVar7;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void mp_lshift_fixed_into(mp_int *r, mp_int *a, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t bitoff = bits % BIGNUM_INT_BITS;

    for (size_t i = r->nw; i-- > 0 ;) {
        if (i < words) {
            r->w[i] = 0;
        } else {
            r->w[i] = mp_word(a, i - words);
            if (bitoff != 0) {
                r->w[i] <<= bitoff;
                if (i > words)
                    r->w[i] |= mp_word(a, i - words - 1) >>
                        (BIGNUM_INT_BITS - bitoff);
            }
        }
    }
}